

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ADPCMA_calc_chan(YM2610 *F2610,ADPCM_CH *ch)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  INT32 IVar4;
  uint uVar5;
  int iVar6;
  
  if (ch->Muted != '\0') {
    return;
  }
  uVar2 = ch->now_step + ch->step;
  ch->now_step = uVar2;
  if (uVar2 < 0x10000) {
    uVar2 = ch->adpcm_out;
  }
  else {
    uVar1 = uVar2 >> 0x10;
    ch->now_step = uVar2 & 0xffff;
    uVar2 = ch->now_addr;
    do {
      if ((uVar2 & 0x1fffff) == (ch->end * 2 & 0x1ffffe)) {
        ch->flag = '\0';
        F2610->adpcm_arrivedEndAddress = F2610->adpcm_arrivedEndAddress | ch->flagMask;
        return;
      }
      if ((uVar2 & 1) == 0) {
        bVar3 = F2610->pcmbuf[uVar2 >> 1];
        ch->now_data = bVar3;
        bVar3 = bVar3 >> 4;
      }
      else {
        bVar3 = ch->now_data & 0xf;
      }
      uVar2 = uVar2 + 1;
      ch->now_addr = uVar2;
      uVar5 = ch->adpcm_acc + jedi_table[(int)(ch->adpcm_step + (uint)bVar3)];
      uVar5 = (int)(uVar5 * 0x100000) >> 0x1f & 0xfffff000U | uVar5 & 0xfff;
      ch->adpcm_acc = uVar5;
      iVar6 = ch->adpcm_step + step_inc[bVar3 & 7];
      ch->adpcm_step = iVar6;
      IVar4 = 0x300;
      if (iVar6 < 0x301) {
        if (iVar6 < 0) {
          IVar4 = 0;
          goto LAB_00125d1b;
        }
      }
      else {
LAB_00125d1b:
        ch->adpcm_step = IVar4;
      }
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
    uVar2 = (int)(uVar5 * (int)ch->vol_mul) >> (ch->vol_shift & 0x1f) & 0xfffffffc;
    ch->adpcm_out = uVar2;
  }
  *ch->pan = *ch->pan + uVar2;
  return;
}

Assistant:

INLINE void ADPCMA_calc_chan( YM2610 *F2610, ADPCM_CH *ch )
{
	UINT32 step;
	UINT8  data;

	if (ch->Muted)
		return;


	ch->now_step += ch->step;
	if ( ch->now_step >= (1<<ADPCM_SHIFT) )
	{
		step = ch->now_step >> ADPCM_SHIFT;
		ch->now_step &= (1<<ADPCM_SHIFT)-1;
		do{
			/* end check */
			/* 11-06-2001 JB: corrected comparison. Was > instead of == */
			/* YM2610 checks lower 20 bits only, the 4 MSB bits are sample bank */
			/* Here we use 1<<21 to compensate for nibble calculations */

			if (   (ch->now_addr & ((1<<21)-1)) == ((ch->end<<1) & ((1<<21)-1))	   )
			{
				ch->flag = 0;
				F2610->adpcm_arrivedEndAddress |= ch->flagMask;
				return;
			}
#if 0
			if ( ch->now_addr > (F2610->pcm_size<<1) )
			{
				emu_logf(&F2610->OPN.logger, DEVLOG_WARN, "YM2610: Attempting to play past adpcm rom size!\n");
				return;
			}
#endif
			if ( ch->now_addr&1 )
				data = ch->now_data & 0x0f;
			else
			{
				ch->now_data = F2610->pcmbuf[ch->now_addr>>1];
				data = (ch->now_data >> 4) & 0x0f;
			}

			ch->now_addr++;

			ch->adpcm_acc += jedi_table[ch->adpcm_step + data];

			/* the 12-bit accumulator wraps on the ym2610 and ym2608 (like the msm5205), it does not saturate (like the msm5218) */
			ch->adpcm_acc &= 0xfff;

			/* extend 12-bit signed int */
			if (ch->adpcm_acc & 0x800)
				ch->adpcm_acc |= ~0xfff;

			ch->adpcm_step += step_inc[data & 7];
			Limit( ch->adpcm_step, 48*16, 0*16 );

		}while(--step);

		/* calc pcm * volume data */
		ch->adpcm_out = ((ch->adpcm_acc * ch->vol_mul) >> ch->vol_shift) & ~3;	/* multiply, shift and mask out 2 LSB bits */
	}

	/* output for work of output channels (out_adpcm[OPNxxxx])*/
	*(ch->pan) += ch->adpcm_out;
}